

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O2

void __thiscall FSDist_COF::FSDist_COF(FSDist_COF *this)

{
  allocator_type local_12;
  allocator_type local_11;
  
  (this->super_FactoredStateDistribution).super_StateDistribution._vptr_StateDistribution =
       (_func_int **)&PTR__FSDist_COF_0061e310;
  this->_m_nrStateFactors = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->_m_sfacDomainSizes,0,&local_11);
  this->_m_stepSize = (size_t *)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_m_probs,0,&local_12);
  return;
}

Assistant:

FSDist_COF::FSDist_COF() :
    _m_nrStateFactors(0),
    _m_sfacDomainSizes(0),
    _m_stepSize(0),
    _m_probs(0)
{
}